

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* __thiscall Parser::parse_labels(Parser *this,string *path)

{
  byte bVar1;
  ostream *this_00;
  reference pvVar2;
  string *in_RDX;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RDI;
  int i;
  int count1;
  char bytes [4];
  ifstream f;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  res;
  reference in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 uVar3;
  int *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__n;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int local_254;
  int local_24c [5];
  long local_238 [68];
  string *local_18;
  
  __n = in_RDI;
  local_18 = in_RDX;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x1434f9);
  std::ifstream::ifstream(local_238,local_18,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_238 + *(long *)(local_238[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::read((char *)local_238,(long)local_24c);
    std::istream::read((char *)local_238,(long)local_24c);
    big_to_little((char *)0x14360c);
    uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffd74);
    if (local_24c[0] != 60000) {
      uVar3 = CONCAT13(local_24c[0] == 10000,(int3)in_stack_fffffffffffffd74);
    }
    if ((char)((uint)uVar3 >> 0x18) == '\0') {
      __assert_fail("count1 == 60000 || count1 == 10000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/utils.cpp"
                    ,0x38,
                    "std::vector<std::vector<float>> Parser::parse_labels(const std::string &)");
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::reserve((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),(size_type)__n);
    for (local_254 = 0; local_254 < local_24c[0]; local_254 = local_254 + 1) {
      std::
      vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
      ::emplace_back<int,int>
                ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                 (int *)CONCAT44(uVar3,in_stack_fffffffffffffd70));
      in_stack_fffffffffffffd68 =
           std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::back((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)CONCAT44(uVar3,in_stack_fffffffffffffd70));
      in_stack_fffffffffffffd70 = std::istream::get();
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffd68,(long)in_stack_fffffffffffffd70);
      *pvVar2 = 1.0;
    }
    std::ifstream::close();
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)CONCAT44(uVar3,in_stack_fffffffffffffd70),
             (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffd68);
  }
  else {
    in_stack_fffffffffffffd80 = std::operator<<((ostream *)&std::cerr,"unable to open: ");
    this_00 = std::operator<<(in_stack_fffffffffffffd80,local_18);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    memset(in_RDI,0,0x18);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x143599);
  }
  local_24c[1] = 1;
  std::ifstream::~ifstream(local_238);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)in_stack_fffffffffffffd80);
  return __n;
}

Assistant:

std::vector<std::vector<float>> Parser::parse_labels(const std::string& path) {
    using namespace std;
    std::vector<std::vector<float>> res;
    ifstream f(path, ios::binary);
    if (!f) {
        cerr << "unable to open: " << path << endl;
        return {};
    }
    char bytes[4];
    f.read(bytes, 4);
    f.read(bytes, 4);
    Parser::big_to_little(bytes);
    int count1;
    count1 = *(reinterpret_cast<int*>(bytes));

    assert(count1 == 60000 || count1 == 10000);
    res.reserve(count1);
    for (int i = 0; i < count1; ++i) {
        res.emplace_back(10, 0);
        res.back()[f.get()] = 1;
    }
    f.close();
    return res;
}